

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O2

void __thiscall indigox::ElectronOpt::DetermineElectronsToAdd(ElectronOpt *this)

{
  element_type *peVar1;
  uint uVar2;
  runtime_error *this_00;
  StoredVertexList *pSVar3;
  StoredVertexList *pSVar4;
  StoredVertexList *pSVar5;
  StoredVertexList *pSVar6;
  CountableObject<indigox::Atom> local_38;
  
  peVar1 = (this->molGraph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this->electronsToAdd_ = -(int)peVar1->totalCharge_;
  pSVar5 = (StoredVertexList *)
           ((long)&((peVar1->super__MolGraph).graph_.
                    super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_type + 0x18);
  pSVar6 = pSVar5;
  while (pSVar6 = *(StoredVertexList **)&pSVar6->super__List_base<void_*,_std::allocator<void_*>_>,
        pSVar6 != pSVar5) {
    Atom::GetElement((Atom *)&stack0xffffffffffffffc8);
    this->electronsToAdd_ = this->electronsToAdd_ + (uint)*(byte *)(local_38.id_ + 0x43);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  }
  pSVar3 = (StoredVertexList *)
           ((long)&((((this->elnGraph_).
                      super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super__ElnGraph).graph_.
                    super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->super_type + 0x18);
  uVar2 = this->electronsToAdd_;
  pSVar4 = pSVar3;
  while (pSVar4 = *(StoredVertexList **)&pSVar4->super__List_base<void_*,_std::allocator<void_*>_>,
        pSVar4 != pSVar3) {
    uVar2 = uVar2 - *(byte *)(*(size_t *)
                               ((long)&pSVar4->super__List_base<void_*,_std::allocator<void_*>_> +
                               0x10) + 0x47);
    this->electronsToAdd_ = uVar2;
  }
  if (Options::AssignElectrons::AUTO_USE_ELECTRON_PAIRS == true) {
    if ((uVar2 & 1) != 0) {
      Options::AssignElectrons::USE_ELECTRON_PAIRS = false;
      return;
    }
    Options::AssignElectrons::USE_ELECTRON_PAIRS = true;
  }
  else if ((Options::AssignElectrons::USE_ELECTRON_PAIRS & 1U) == 0) {
    return;
  }
  if ((uVar2 & 1) == 0) {
    this->electronsToAdd_ = uVar2 >> 1;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Unable to handle odd number of electrons when using electron pairs.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ElectronOpt::DetermineElectronsToAdd() {
  electronsToAdd_ = -molGraph_->GetTotalCharge();
  MolVertIterPair vs = molGraph_->GetVertices();
  for (MolVertexIter v = vs.first; v != vs.second; ++v)
    electronsToAdd_ += molGraph_->GetProperties(*v)->atom->GetElement()->GetValenceElectronCount();
  // All bonds should have order of at least 1
  // Preplace code
  ElnVertIterPair elnvs = elnGraph_->GetVertices();
  for (; elnvs.first != elnvs.second; ++elnvs.first)
    electronsToAdd_ -= elnGraph_->GetProperties(*elnvs.first)->pre_placed;
  //electronsToAdd_ -= 2 * molGraph_->NumEdges();
  // End Preplace code
  
  if (opt_::AUTO_USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    opt_::USE_ELECTRON_PAIRS = false;
  else if (opt_::AUTO_USE_ELECTRON_PAIRS)
    opt_::USE_ELECTRON_PAIRS = true;
  
  if (opt_::USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    throw std::runtime_error("Unable to handle odd number of electrons when using electron pairs.");
  else if (opt_::USE_ELECTRON_PAIRS)
    electronsToAdd_ /= 2;
}